

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

SceneSignal __thiscall GroundScene::process(GroundScene *this,int state)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (state == 1) {
    uVar2 = (ulong)(this->plants[this->selectY][this->selectX] == (Plant *)0x0);
    uVar3 = 0xc;
  }
  else if (state == 0) {
    uVar1 = Suns::clearSun(this->suns[this->selectY][this->selectX]);
    uVar2 = (ulong)uVar1;
    uVar3 = 0xb;
  }
  else {
    uVar3 = 10;
    uVar2 = 0;
  }
  return (SceneSignal)(uVar2 << 0x20 | uVar3);
}

Assistant:

SceneSignal GroundScene::process(int state){
	SceneSignal signal(GS_SIGNAL_NULL, 0);
	if(state == STATE_NORMAL){
		signal.type = GS_SIGNAL_ADD_SUN;
		signal.data = suns[selectY][selectX]->clearSun();
	}
	else if(state == STATE_PLANT){
		signal.type = GS_SIGNAL_PLANT_VALID;
		if(plants[selectY][selectX] == NULL){
			signal.data = 1;
		}	
		else{
			signal.data = 0;
		}
	}
	return signal;
}